

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__compute_transparency(stbi__png *z,stbi_uc *tc,int out_n)

{
  int in_EAX;
  char *in_RCX;
  undefined4 in_register_00000014;
  long lVar1;
  long lVar2;
  int iVar3;
  int in_R8D;
  
  lVar1 = CONCAT44(in_register_00000014,out_n);
  iVar3 = (int)z * (int)tc;
  if (in_R8D == 2) {
    if (iVar3 != 0) {
      lVar2 = 0;
      do {
        *(char *)(lVar1 + 1 + lVar2 * 2) = -(*(char *)(lVar1 + lVar2 * 2) != *in_RCX);
        lVar2 = lVar2 + 1;
        in_EAX = iVar3;
      } while (iVar3 != (int)lVar2);
    }
  }
  else {
    if (in_R8D != 4) {
      __assert_fail("out_n == 2 || out_n == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                    ,0x12c3,"int stbi__compute_transparency(stbi__png *, stbi_uc *, int)");
    }
    if (iVar3 != 0) {
      lVar2 = 0;
      do {
        if (((*(char *)(lVar1 + lVar2 * 4) == *in_RCX) &&
            (*(char *)(lVar1 + 1 + lVar2 * 4) == in_RCX[1])) &&
           (*(char *)(lVar1 + 2 + lVar2 * 4) == in_RCX[2])) {
          *(undefined1 *)(lVar1 + 3 + lVar2 * 4) = 0;
        }
        lVar2 = lVar2 + 1;
        in_EAX = iVar3;
      } while (iVar3 != (int)lVar2);
    }
  }
  return in_EAX;
}

Assistant:

static int stbi__compute_transparency(stbi__png *z, stbi_uc tc[3], int out_n)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   // compute color-based transparency, assuming we've
   // already got 255 as the alpha value in the output
   STBI_ASSERT(out_n == 2 || out_n == 4);

   if (out_n == 2) {
      for (i=0; i < pixel_count; ++i) {
         p[1] = (p[0] == tc[0] ? 0 : 255);
         p += 2;
      }
   } else {
      for (i=0; i < pixel_count; ++i) {
         if (p[0] == tc[0] && p[1] == tc[1] && p[2] == tc[2])
            p[3] = 0;
         p += 4;
      }
   }
   return 1;
}